

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O0

void __thiscall
QtMWidgets::NavigationButton::NavigationButton
          (NavigationButton *this,Direction direction,QString *text,QWidget *parent)

{
  NavigationButtonPrivate *this_00;
  NavigationButtonPrivate *this_01;
  Object local_68 [8];
  code *local_60;
  undefined8 uStack_58;
  code *local_50;
  undefined8 local_48;
  Object local_40 [24];
  QWidget *local_28;
  QWidget *parent_local;
  QString *text_local;
  NavigationButton *pNStack_10;
  Direction direction_local;
  NavigationButton *this_local;
  
  local_28 = parent;
  parent_local = (QWidget *)text;
  text_local._4_4_ = direction;
  pNStack_10 = this;
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_00241de8;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationButton_00241fb0;
  this_00 = (NavigationButtonPrivate *)operator_new(0x40);
  NavigationButtonPrivate::NavigationButtonPrivate(this_00,this,text_local._4_4_);
  QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
            ::operator->(&this->d);
  NavigationButtonPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  QAbstractButton::setText((QString *)this);
  local_50 = QAbstractButton::pressed;
  local_48 = 0;
  local_60 = _q_pressed;
  uStack_58 = 0;
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::NavigationButton::*)()>
            (local_40,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::pressed,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::NavigationButton::*)()>
            (local_68,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::released,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  return;
}

Assistant:

NavigationButton::NavigationButton( Direction direction, const QString & text,
	QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new NavigationButtonPrivate( this, direction ) )
{
	d->init();

	setText( text );

	connect( this, &QAbstractButton::pressed,
		this, &NavigationButton::_q_pressed );
	connect( this, &QAbstractButton::released,
		this, &NavigationButton::_q_released );
}